

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O3

void __thiscall
el::LogMessage::LogMessage
          (LogMessage *this,Level level,string *file,LineNumber line,string *func,
          VerboseLevel verboseLevel,Logger *logger)

{
  pointer pcVar1;
  
  this->m_level = level;
  (this->m_file)._M_dataplus._M_p = (pointer)&(this->m_file).field_2;
  pcVar1 = (file->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_file,pcVar1,pcVar1 + file->_M_string_length);
  this->m_line = line;
  (this->m_func)._M_dataplus._M_p = (pointer)&(this->m_func).field_2;
  pcVar1 = (func->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_func,pcVar1,pcVar1 + func->_M_string_length);
  this->m_verboseLevel = verboseLevel;
  this->m_logger = logger;
  std::__cxx11::stringbuf::str();
  return;
}

Assistant:

LogMessage(Level level, const std::string& file, base::type::LineNumber line, const std::string& func,
             base::type::VerboseLevel verboseLevel, Logger* logger) :
    m_level(level), m_file(file), m_line(line), m_func(func),
    m_verboseLevel(verboseLevel), m_logger(logger), m_message(logger->stream().str()) {
  }